

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Synthesizer.cpp
# Opt level: O3

void Synthesizer::HandleEvent(EffectData *data,UInt32 msg,float sampletime)

{
  uint uVar1;
  Voice *pVVar2;
  uint uVar3;
  uint velocity;
  long lVar4;
  uint key;
  float fVar5;
  
  uVar1 = (msg & 0xf0) - 0x80 >> 4;
  if (uVar1 < 8) {
    uVar3 = msg & 0xf;
    key = msg >> 8 & 0xff;
    velocity = msg >> 0x10 & 0xff;
    switch(uVar1) {
    case 1:
      if (velocity != 0) {
        data->arpkeys[key] = 1;
        pVVar2 = SynthesizerChannel::AllocateVoice(data->synthchannel + uVar3,key);
        Voice::NoteOn(pVVar2,key,velocity,data->p,sampletime);
        return;
      }
    case 0:
      data->arpkeys[key] = 0;
      pVVar2 = data->synthchannel[uVar3].keys[key];
      if (pVVar2 != (Voice *)0x0) {
        fVar5 = powf(0.0001,pVVar2->sampletime / pVVar2->p[5]);
        pVVar2->aenvdecay = fVar5;
        pVVar2->fenvdecay = fVar5;
        if (data->synthchannel[uVar3].keys[key] == pVVar2) {
          data->synthchannel[uVar3].keys[key] = (Voice *)0x0;
        }
      }
      break;
    case 3:
      data->synthchannel[uVar3].ctrl[key] = (float)velocity * 0.007874016;
      break;
    case 7:
      if (uVar3 == 8) {
        lVar4 = 0;
        scheduledata.writepos = 0;
        scheduledata.readpos = 0;
        memset(data->arpkeys,0,0x204);
        do {
          memset((void *)((long)data->synthchannel[0].keys + lVar4),0,0x400);
          *(undefined4 *)((long)&data->synthchannel[0].numvoices + lVar4) = 0;
          lVar4 = lVar4 + 0x708;
        } while (lVar4 != 0x7080);
      }
    }
  }
  return;
}

Assistant:

static void HandleEvent(EffectData* data, UInt32 msg, float sampletime)
    {
        int channel = msg & 15;
        int command = msg & 0xF0;
        int data1 = (msg >> 8) & 255;
        int data2 = (msg >> 16) & 255;
        SynthesizerChannel* synthchannel = &data->synthchannel[channel];
        switch (command)
        {
            case 0x90:
                if (data2 > 0)
                {
                    data->arpkeys[data1] = 1;
                    synthchannel->NoteOn(data1, data2, data->p, sampletime);
                    break;
                }
            case 0x80:
                data->arpkeys[data1] = 0;
                synthchannel->NoteOff(data1, data2, data->p, sampletime);
                break;
            case 0xB0:
                synthchannel->Control(data1, data2, data->p, sampletime);
                break;
            case 0xF0:
                if (channel == 8)
                {
                    // All sound off
                    scheduledata.Clear();
                    data->numpending = 0;
                    memset(data->arpkeys, 0, sizeof(data->arpkeys));
                    for (int c = 0; c < 16; c++)
                    {
                        SynthesizerChannel* synthchannel = &data->synthchannel[c];
                        memset(synthchannel->keys, 0, sizeof(synthchannel->keys));
                        synthchannel->numvoices = 0;
                    }
                }
                break;
        }
    }